

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlantUmlGenerator.cpp
# Opt level: O1

void __thiscall
PlantUmlGenerator::beginState
          (PlantUmlGenerator *this,ostream *output,string *indent,ScName *name,ScName *nameAlias)

{
  const_iterator cVar1;
  ostream *poVar2;
  long lVar3;
  char *pcVar4;
  ScName nameShort;
  ScName local_48;
  
  removeNamespaces(&local_48,name);
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find(&(this->super_AbstractGenerator).m_highlightSet._M_t,name);
  pcVar4 = (indent->_M_dataplus)._M_p;
  if ((_Rb_tree_header *)cVar1._M_node ==
      &(this->super_AbstractGenerator).m_highlightSet._M_t._M_impl.super__Rb_tree_header) {
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (output,pcVar4,indent->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"state \"",7);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,local_48._M_dataplus._M_p,local_48._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\" as ",5);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,(nameAlias->_M_dataplus)._M_p,nameAlias->_M_string_length);
    lVar3 = 3;
    pcVar4 = " {\n";
  }
  else {
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (output,pcVar4,indent->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"state \"",7);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,local_48._M_dataplus._M_p,local_48._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\" as ",5);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,(nameAlias->_M_dataplus)._M_p,nameAlias->_M_string_length);
    lVar3 = 0xe;
    pcVar4 = " #IndianRed {\n";
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar4,lVar3);
  std::__cxx11::string::append((char *)indent);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void PlantUmlGenerator::beginState(std::ostream &output, std::string &indent, const ScName &name,
                                   const ScName &nameAlias)
{
    const ScName nameShort = removeNamespaces(name);

    if (isHighlighted(name)) {
        output << indent << "state \"" << nameShort << "\" as " << nameAlias << " #IndianRed {\n";
    } else {
        output << indent << "state \"" << nameShort << "\" as " << nameAlias << " {\n";
    }

    indent.append("  ");
}